

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::RenderCustomTexData(ImFontAtlas *this,int pass,void *p_rects)

{
  value_type *pvVar1;
  uchar uVar2;
  ImVec2 local_af0;
  ImVec2 local_ae8;
  ImVec2 local_ae0;
  ImVec2 local_ad8;
  ImVec2 local_ad0;
  ImVec2 local_ac8;
  ImVec2 local_ac0;
  ImVec2 size;
  ImVec2 local_ab0;
  ImVec2 pos;
  ImGuiMouseCursorData *cursor_data;
  int type;
  ImVec2 cursor_datas [7] [3];
  ImVec2 local_9e4;
  ImVec2 tex_uv_scale;
  int offset1;
  int offset0;
  int x;
  int n;
  int y;
  stbrp_rect *r_1;
  stbrp_rect r;
  ImVector<stbrp_rect> *rects;
  char texture_data [2431];
  int TEX_DATA_H;
  int TEX_DATA_W;
  void *p_rects_local;
  int pass_local;
  ImFontAtlas *this_local;
  
  stack0xffffffffffffffdc = 0x5a;
  texture_data[0x978] = '\x1b';
  texture_data[0x979] = '\0';
  texture_data[0x97a] = '\0';
  texture_data[0x97b] = '\0';
  memcpy(&rects,
         "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
         ,0x97f);
  r._8_8_ = p_rects;
  if (pass == 0) {
    memset(&r_1,0,0x10);
    r_1._4_2_ = 0xb5;
    r_1._6_2_ = 0x1c;
    ImVector<stbrp_rect>::push_back((ImVector<stbrp_rect> *)r._8_8_,(value_type *)&r_1);
  }
  else if (pass == 1) {
    pvVar1 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)p_rects,0);
    offset0 = 0;
    for (x = 0; x < 0x1b; x = x + 1) {
      for (offset1 = 0; offset1 < 0x5a; offset1 = offset1 + 1) {
        tex_uv_scale.y = (float)((uint)pvVar1->x + offset1 + ((uint)pvVar1->y + x) * this->TexWidth)
        ;
        tex_uv_scale.x = (float)((int)tex_uv_scale.y + 0x5b);
        uVar2 = '\0';
        if (texture_data[(long)offset0 + -8] == '.') {
          uVar2 = 0xff;
        }
        this->TexPixelsAlpha8[(int)tex_uv_scale.y] = uVar2;
        uVar2 = '\0';
        if (texture_data[(long)offset0 + -8] == 'X') {
          uVar2 = 0xff;
        }
        this->TexPixelsAlpha8[(int)tex_uv_scale.y + 0x5b] = uVar2;
        offset0 = offset0 + 1;
      }
    }
    ImVec2::ImVec2(&local_9e4,1.0 / (float)this->TexWidth,1.0 / (float)this->TexHeight);
    ImVec2::ImVec2((ImVec2 *)&cursor_datas[6][2].y,((float)pvVar1->x + 0.5) * local_9e4.x,
                   ((float)pvVar1->y + 0.5) * local_9e4.y);
    this->TexUvWhitePixel = stack0xfffffffffffff614;
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffff568,0.0,3.0);
    ImVec2::ImVec2(cursor_datas[0],12.0,19.0);
    ImVec2::ImVec2(cursor_datas[0] + 1,0.0,0.0);
    ImVec2::ImVec2(cursor_datas[0] + 2,13.0,0.0);
    ImVec2::ImVec2(cursor_datas[1],7.0,16.0);
    ImVec2::ImVec2(cursor_datas[1] + 1,4.0,8.0);
    ImVec2::ImVec2(cursor_datas[1] + 2,31.0,0.0);
    ImVec2::ImVec2(cursor_datas[2],23.0,23.0);
    ImVec2::ImVec2(cursor_datas[2] + 1,11.0,11.0);
    ImVec2::ImVec2(cursor_datas[2] + 2,21.0,0.0);
    ImVec2::ImVec2(cursor_datas[3],9.0,23.0);
    ImVec2::ImVec2(cursor_datas[3] + 1,5.0,11.0);
    ImVec2::ImVec2(cursor_datas[3] + 2,55.0,18.0);
    ImVec2::ImVec2(cursor_datas[4],23.0,9.0);
    ImVec2::ImVec2(cursor_datas[4] + 1,11.0,5.0);
    ImVec2::ImVec2(cursor_datas[4] + 2,73.0,0.0);
    ImVec2::ImVec2(cursor_datas[5],17.0,17.0);
    ImVec2::ImVec2(cursor_datas[5] + 1,9.0,9.0);
    ImVec2::ImVec2(cursor_datas[5] + 2,55.0,0.0);
    ImVec2::ImVec2(cursor_datas[6],17.0,17.0);
    ImVec2::ImVec2(cursor_datas[6] + 1,9.0,9.0);
    for (cursor_data._4_4_ = 0; cursor_data._4_4_ < 7; cursor_data._4_4_ = cursor_data._4_4_ + 1) {
      pos = (ImVec2)(GImGui->MouseCursorData + cursor_data._4_4_);
      ImVec2::ImVec2(&size,(float)pvVar1->x,(float)pvVar1->y);
      local_ab0 = ::operator+((ImVec2 *)(&stack0xfffffffffffff568 + (long)cursor_data._4_4_ * 0x18),
                              &size);
      local_ac0 = cursor_datas[cursor_data._4_4_][0];
      *(int *)pos = cursor_data._4_4_;
      *(ImVec2 *)((long)pos + 0xc) = local_ac0;
      *(ImVec2 *)((long)pos + 4) = cursor_datas[cursor_data._4_4_][1];
      local_ac8 = ::operator*(&local_ab0,&local_9e4);
      *(ImVec2 *)((long)pos + 0x14) = local_ac8;
      local_ad8 = ::operator+(&local_ab0,&local_ac0);
      local_ad0 = ::operator*(&local_ad8,&local_9e4);
      *(ImVec2 *)((long)pos + 0x24) = local_ad0;
      local_ab0.x = local_ab0.x + 91.0;
      local_ae0 = ::operator*(&local_ab0,&local_9e4);
      *(ImVec2 *)((long)pos + 0x1c) = local_ae0;
      local_af0 = ::operator+(&local_ab0,&local_ac0);
      local_ae8 = ::operator*(&local_af0,&local_9e4);
      *(ImVec2 *)((long)pos + 0x2c) = local_ae8;
    }
  }
  return;
}

Assistant:

void ImFontAtlas::RenderCustomTexData(int pass, void* p_rects)
{
    // A work of art lies ahead! (. = white layer, X = black layer, others are blank)
    // The white texels on the top left are the ones we'll use everywhere in ImGui to render filled shapes.
    const int TEX_DATA_W = 90;
    const int TEX_DATA_H = 27;
    const char texture_data[TEX_DATA_W*TEX_DATA_H+1] =
    {
        "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX"
        "..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X"
        "---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X"
        "X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X"
        "XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X"
        "X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X"
        "X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX"
        "X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      "
        "X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       "
        "X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        "
        "X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         "
        "X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          "
        "X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           "
        "X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            "
        "X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           "
        "X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          "
        "X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          "
        "X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------"
        "X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           "
        "XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -           "
        "      X..X          -  X...X  -         X...X         -  X..X           X..X  -           "
        "       XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           "
        "------------        -    X    -           X           -X.....................X-           "
        "                    ----------------------------------- X...XXXXXXXXXXXXX...X -           "
        "                                                      -  X..X           X..X  -           "
        "                                                      -   X.X           X.X   -           "
        "                                                      -    XX           XX    -           "
    };

    ImVector<stbrp_rect>& rects = *(ImVector<stbrp_rect>*)p_rects;
    if (pass == 0)
    {
        // Request rectangles
        stbrp_rect r;
        memset(&r, 0, sizeof(r));
        r.w = (TEX_DATA_W*2)+1;
        r.h = TEX_DATA_H+1;
        rects.push_back(r);
    }
    else if (pass == 1)
    {
        // Render/copy pixels
        const stbrp_rect& r = rects[0];
        for (int y = 0, n = 0; y < TEX_DATA_H; y++)
            for (int x = 0; x < TEX_DATA_W; x++, n++)
            {
                const int offset0 = (int)(r.x + x) + (int)(r.y + y) * TexWidth;
                const int offset1 = offset0 + 1 + TEX_DATA_W;
                TexPixelsAlpha8[offset0] = texture_data[n] == '.' ? 0xFF : 0x00;
                TexPixelsAlpha8[offset1] = texture_data[n] == 'X' ? 0xFF : 0x00;
            }
        const ImVec2 tex_uv_scale(1.0f / TexWidth, 1.0f / TexHeight);
        TexUvWhitePixel = ImVec2((r.x + 0.5f) * tex_uv_scale.x, (r.y + 0.5f) * tex_uv_scale.y);

        // Setup mouse cursors
        const ImVec2 cursor_datas[ImGuiMouseCursor_Count_][3] =
        {
            // Pos ........ Size ......... Offset ......
            { ImVec2(0,3),  ImVec2(12,19), ImVec2( 0, 0) }, // ImGuiMouseCursor_Arrow
            { ImVec2(13,0), ImVec2(7,16),  ImVec2( 4, 8) }, // ImGuiMouseCursor_TextInput
            { ImVec2(31,0), ImVec2(23,23), ImVec2(11,11) }, // ImGuiMouseCursor_Move
            { ImVec2(21,0), ImVec2( 9,23), ImVec2( 5,11) }, // ImGuiMouseCursor_ResizeNS
            { ImVec2(55,18),ImVec2(23, 9), ImVec2(11, 5) }, // ImGuiMouseCursor_ResizeEW
            { ImVec2(73,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNESW
            { ImVec2(55,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNWSE
        };

        for (int type = 0; type < ImGuiMouseCursor_Count_; type++)
        {
            ImGuiMouseCursorData& cursor_data = GImGui->MouseCursorData[type];
            ImVec2 pos = cursor_datas[type][0] + ImVec2((float)r.x, (float)r.y);
            const ImVec2 size = cursor_datas[type][1];
            cursor_data.Type = type;
            cursor_data.Size = size;
            cursor_data.HotOffset = cursor_datas[type][2];
            cursor_data.TexUvMin[0] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[0] = (pos + size) * tex_uv_scale;
            pos.x += TEX_DATA_W+1;
            cursor_data.TexUvMin[1] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[1] = (pos + size) * tex_uv_scale;
        }
    }
}